

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_freeaddrinfo.c
# Opt level: O2

void ares_freeaddrinfo_cnames(ares_addrinfo_cname *head)

{
  ares_addrinfo_cname *paVar1;
  
  while (head != (ares_addrinfo_cname *)0x0) {
    paVar1 = head->next;
    ares_free(head->alias);
    ares_free(head->name);
    ares_free(head);
    head = paVar1;
  }
  return;
}

Assistant:

void ares_freeaddrinfo_cnames(struct ares_addrinfo_cname *head)
{
  struct ares_addrinfo_cname *current;
  while (head) {
    current = head;
    head    = head->next;
    ares_free(current->alias);
    ares_free(current->name);
    ares_free(current);
  }
}